

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::text_format_unittest::AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test::
TestBody(AbslStringifyTest_StringifyMetaAnnotatedIsRedacted_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *message;
  size_t in_R9;
  string_view value;
  string_view format;
  string result;
  TestRedactedMessage proto;
  element_type *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  undefined1 local_120;
  char local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  char *local_100;
  long local_f8;
  char *local_f0;
  AssertHelper local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_c0;
  StringifySink local_a8;
  undefined1 local_88 [104];
  StringLike<std::__cxx11::basic_string<char>_> *regex;
  
  proto2_unittest::TestRedactedMessage::TestRedactedMessage
            ((TestRedactedMessage *)local_88,(Arena *)0x0);
  local_88[0x10] = local_88[0x10] | 2;
  if ((local_88._8_8_ & 1) != 0) {
    local_88._8_8_ = *(undefined8 *)(local_88._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "foo";
  value._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)(local_88 + 0x20),value,(Arena *)local_88._8_8_);
  local_d8 = 0;
  local_d0[0] = 0;
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xe;
  local_100 = "goo\\.gle/.+  +";
  local_f8 = 0xc;
  local_f0 = "\\[REDACTED\\]";
  format._M_str = (char *)&local_108;
  format._M_len = (size_t)"$0\nmeta_annotated: $1\n";
  local_e0.data_ = (AssertHelperData *)local_d0;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_e0,(Nonnull<std::string_*>)&DAT_00000016,format,
             (Nullable<const_absl::string_view_*>)0x2,in_R9);
  testing::MatchesRegex<std::__cxx11::string>(&local_c0,(testing *)&local_e0,regex);
  if (local_c0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_130 = local_c0.impl_.regex_.
                super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_120 = local_c0.impl_.full_match_;
    goto LAB_00985a11;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_c0.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_c0.impl_.regex_.
          super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') {
      iVar2 = (local_c0.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count;
      goto LAB_00985a03;
    }
    LOCK();
    (local_c0.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count =
         (local_c0.impl_.regex_.
          super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    iVar2 = (local_c0.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count + 1;
    (local_c0.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = iVar2;
LAB_00985a03:
    (local_c0.impl_.regex_.
     super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = iVar2 + 1;
  }
  local_128 = local_c0.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  local_130 = local_c0.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_120 = local_c0.impl_.full_match_;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_c0.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi);
LAB_00985a11:
  paVar1 = &local_a8.buffer_.field_2;
  local_a8.buffer_.field_2._M_allocated_capacity = 0;
  local_a8.buffer_.field_2._8_8_ = 0;
  local_a8.buffer_._M_string_length = 0;
  local_a8.buffer_._M_dataplus._M_p = (pointer)paVar1;
  AbslStringify<absl::lts_20250127::strings_internal::StringifySink>(&local_a8,(Message *)local_88);
  local_108._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,local_a8.buffer_._M_dataplus._M_p,
             local_a8.buffer_._M_dataplus._M_p + local_a8.buffer_._M_string_length);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>>
  ::operator()(local_118,(char *)&local_130,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "absl::StrCat(proto)");
  if (local_108._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8) {
    operator_delete(local_108._M_head_impl,local_f8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.buffer_._M_dataplus._M_p,
                    local_a8.buffer_.field_2._M_allocated_capacity + 1);
  }
  if (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  }
  if (local_c0.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.impl_.regex_.
               super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e0.data_ != (AssertHelperData *)local_d0) {
    operator_delete(local_e0.data_,CONCAT71(local_d0._1_7_,local_d0[0]) + 1);
  }
  if (local_118[0] == '\0') {
    testing::Message::Message((Message *)&local_108);
    if (local_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = (local_110->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0xaaa,message);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (local_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_110,local_110);
  }
  proto2_unittest::TestRedactedMessage::~TestRedactedMessage((TestRedactedMessage *)local_88);
  return;
}

Assistant:

TEST(AbslStringifyTest, StringifyMetaAnnotatedIsRedacted) {
  unittest::TestRedactedMessage proto;
  proto.set_meta_annotated("foo");
  EXPECT_THAT(absl::StrCat(proto), testing::MatchesRegex(absl::Substitute(
                                       "$0\n"
                                       "meta_annotated: $1\n",
                                       kTextMarkerRegex, value_replacement)));
}